

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_math.c
# Opt level: O1

void sigrsqrt_setup(void)

{
  _class *c;
  t_symbol *ptVar1;
  
  ptVar1 = gensym("rsqrt~");
  sigrsqrt_class = class_new(ptVar1,sigrsqrt_new,(t_method)0x0,0x38,0,A_NULL);
  ptVar1 = gensym("q8_rsqrt~");
  class_addcreator(sigrsqrt_new,ptVar1,A_NULL);
  class_domainsignalin(sigrsqrt_class,0x30);
  c = sigrsqrt_class;
  ptVar1 = gensym("dsp");
  class_addmethod(c,sigrsqrt_dsp,ptVar1,A_CANT,0);
  return;
}

Assistant:

void sigrsqrt_setup(void)
{
    sigrsqrt_class = class_new(gensym("rsqrt~"), (t_newmethod)sigrsqrt_new, 0,
        sizeof(t_sigrsqrt), 0, 0);
            /* an old name for it: */
    class_addcreator(sigrsqrt_new, gensym("q8_rsqrt~"), 0);
    CLASS_MAINSIGNALIN(sigrsqrt_class, t_sigrsqrt, x_f);
    class_addmethod(sigrsqrt_class, (t_method)sigrsqrt_dsp,
        gensym("dsp"), A_CANT, 0);
}